

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort_test.c
# Opt level: O0

int main(void)

{
  REF_STATUS RVar1;
  REF_INT RVar2;
  REF_LONG ref_private_status_reis_bi_69;
  REF_LONG ref_private_status_reis_ai_69;
  REF_STATUS ref_private_macro_code_rss_42;
  REF_INT i_3;
  REF_INT count_1 [1000000];
  REF_INT permutation [1000000];
  REF_INT n_21;
  REF_LONG ref_private_status_reis_bi_68;
  REF_LONG ref_private_status_reis_ai_68;
  REF_LONG ref_private_status_reis_bi_67;
  REF_LONG ref_private_status_reis_ai_67;
  REF_INT n_20;
  REF_INT j;
  REF_INT i_2;
  REF_INT m_1;
  REF_INT count [16];
  REF_INT max;
  REF_INT min;
  REF_LONG ref_private_status_reis_bi_66;
  REF_LONG ref_private_status_reis_ai_66;
  REF_LONG ref_private_status_reis_bi_65;
  REF_LONG ref_private_status_reis_ai_65;
  REF_LONG ref_private_status_reis_bi_64;
  REF_LONG ref_private_status_reis_ai_64;
  REF_LONG ref_private_status_reis_bi_63;
  REF_LONG ref_private_status_reis_ai_63;
  int local_8c8;
  REF_STATUS ref_private_macro_code_rss_41;
  REF_INT sorted_index_8 [4];
  REF_DBL original_10 [4];
  REF_INT n_19;
  REF_LONG ref_private_status_reis_bi_62;
  REF_LONG ref_private_status_reis_ai_62;
  REF_LONG ref_private_status_reis_bi_61;
  REF_LONG ref_private_status_reis_ai_61;
  REF_LONG ref_private_status_reis_bi_60;
  REF_LONG ref_private_status_reis_ai_60;
  REF_STATUS ref_private_macro_code_rss_40;
  REF_INT sorted_index_7 [3];
  REF_INT original_9 [3];
  REF_INT n_18;
  REF_LONG ref_private_status_reis_bi_59;
  REF_LONG ref_private_status_reis_ai_59;
  REF_LONG ref_private_status_reis_bi_58;
  REF_LONG ref_private_status_reis_ai_58;
  REF_LONG ref_private_status_reis_bi_57;
  REF_LONG ref_private_status_reis_ai_57;
  REF_STATUS ref_private_macro_code_rss_39;
  REF_INT sorted_index_6 [3];
  REF_INT original_8 [3];
  REF_INT n_17;
  REF_LONG ref_private_status_reis_bi_56;
  REF_LONG ref_private_status_reis_ai_56;
  REF_LONG ref_private_status_reis_bi_55;
  REF_LONG ref_private_status_reis_ai_55;
  REF_STATUS ref_private_macro_code_rss_38;
  REF_INT sorted_index_5 [2];
  REF_INT original_7 [2];
  REF_INT n_16;
  REF_LONG ref_private_status_reis_bi_54;
  REF_LONG ref_private_status_reis_ai_54;
  REF_LONG ref_private_status_reis_bi_53;
  REF_LONG ref_private_status_reis_ai_53;
  REF_STATUS ref_private_macro_code_rss_37;
  REF_INT sorted_index_4 [2];
  REF_INT original_6 [2];
  REF_INT n_15;
  REF_LONG ref_private_status_reis_bi_52;
  REF_LONG ref_private_status_reis_ai_52;
  REF_STATUS ref_private_macro_code_rss_36;
  REF_INT sorted_index_3 [1];
  REF_INT original_5 [1];
  REF_INT n_14;
  REF_LONG ref_private_status_reis_bi_51;
  REF_LONG ref_private_status_reis_ai_51;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_INT sorted_index_2 [1];
  REF_INT original_4 [1];
  REF_INT n_13;
  REF_LONG ref_private_status_reis_bi_50;
  REF_LONG ref_private_status_reis_ai_50;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_LONG ref_private_status_reis_bi_49;
  REF_LONG ref_private_status_reis_ai_49;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_LONG ref_private_status_reis_bi_48;
  REF_LONG ref_private_status_reis_ai_48;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_LONG ref_private_status_reis_bi_47;
  REF_LONG ref_private_status_reis_ai_47;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_LONG ref_private_status_reis_bi_46;
  REF_LONG ref_private_status_reis_ai_46;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_LONG ref_private_status_reis_bi_45;
  REF_LONG ref_private_status_reis_ai_45;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_LONG ref_private_status_reis_bi_44;
  REF_LONG ref_private_status_reis_ai_44;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_LONG ref_private_status_reis_bi_43;
  REF_LONG ref_private_status_reis_ai_43;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_LONG ref_private_status_reis_bi_42;
  REF_LONG ref_private_status_reis_ai_42;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_LONG ref_private_status_reis_bi_41;
  REF_LONG ref_private_status_reis_ai_41;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_LONG ref_private_status_reis_bi_40;
  REF_LONG ref_private_status_reis_ai_40;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_LONG ref_private_status_reis_bi_39;
  REF_LONG ref_private_status_reis_ai_39;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_LONG ref_private_status_reis_bi_38;
  REF_LONG ref_private_status_reis_ai_38;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_LONG ref_private_status_reis_bi_37;
  REF_LONG ref_private_status_reis_ai_37;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_LONG ref_private_status_reis_bi_36;
  REF_LONG ref_private_status_reis_ai_36;
  REF_LONG ref_private_status_reis_bi_35;
  REF_LONG ref_private_status_reis_ai_35;
  REF_DBL ascending_list_2 [4];
  REF_INT local_5a0;
  REF_INT local_59c;
  REF_INT position_4;
  REF_INT n_12;
  REF_LONG ref_private_status_reis_bi_34;
  REF_LONG ref_private_status_reis_ai_34;
  REF_LONG ref_private_status_reis_bi_33;
  REF_LONG ref_private_status_reis_ai_33;
  REF_GLOB *ascending_list_1;
  REF_INT position_3;
  REF_INT n_11;
  REF_LONG ref_private_status_reis_bi_32;
  REF_LONG ref_private_status_reis_ai_32;
  REF_LONG ref_private_status_reis_bi_31;
  REF_LONG ref_private_status_reis_ai_31;
  REF_LONG ref_private_status_reis_bi_30;
  REF_LONG ref_private_status_reis_ai_30;
  REF_LONG ref_private_status_reis_bi_29;
  REF_LONG ref_private_status_reis_ai_29;
  REF_LONG ref_private_status_reis_bi_28;
  REF_LONG ref_private_status_reis_ai_28;
  REF_LONG ref_private_status_reis_bi_27;
  REF_LONG ref_private_status_reis_ai_27;
  REF_LONG ref_private_status_reis_bi_26;
  REF_LONG ref_private_status_reis_ai_26;
  long lStack_4f0;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_LONG ref_private_status_reis_bi_25;
  REF_LONG ref_private_status_reis_ai_25;
  long lStack_4d8;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_LONG ref_private_status_reis_bi_24;
  REF_LONG ref_private_status_reis_ai_24;
  long lStack_4c0;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_LONG ref_private_status_reis_bi_23;
  REF_LONG ref_private_status_reis_ai_23;
  REF_GLOB RStack_4a8;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_GLOB ascending_list [4];
  REF_INT position_2;
  REF_INT n_10;
  REF_LONG ref_private_status_reis_bi_22;
  REF_LONG ref_private_status_reis_ai_22;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_LONG ref_private_status_reis_bi_21;
  REF_LONG ref_private_status_reis_ai_21;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_LONG ref_private_status_reis_bi_20;
  REF_LONG ref_private_status_reis_ai_20;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_LONG ref_private_status_reis_bi_19;
  REF_LONG ref_private_status_reis_ai_19;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_INT position_1;
  REF_INT sorted_index_1 [4];
  int local_400;
  REF_INT i_1;
  REF_INT n_9;
  REF_GLOB sorted_global_1 [4];
  REF_GLOB global_1 [4];
  REF_LONG ref_private_status_reis_bi_18;
  REF_LONG ref_private_status_reis_ai_18;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_LONG ref_private_status_reis_bi_17;
  REF_LONG ref_private_status_reis_ai_17;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi_16;
  REF_LONG ref_private_status_reis_ai_16;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_INT total;
  REF_INT position;
  REF_INT sorted_index [7];
  REF_INT pack [7];
  REF_GLOB sorted_global [7];
  long local_2e8;
  REF_GLOB global [7];
  int local_2a8;
  REF_INT i;
  REF_INT n_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_BOOL same_3;
  REF_INT list1_3 [4];
  REF_INT list0_3 [4];
  REF_INT n_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_BOOL same_2;
  REF_INT list1_2 [4];
  REF_INT list0_2 [4];
  REF_INT n_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_BOOL same_1;
  REF_INT list1_1 [4];
  REF_INT list0_1 [4];
  REF_INT n_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_BOOL same;
  REF_INT list1 [4];
  REF_INT list0 [4];
  REF_INT n_4;
  REF_LONG ref_private_status_reis_bi_15;
  REF_LONG ref_private_status_reis_ai_15;
  REF_LONG ref_private_status_reis_bi_14;
  REF_LONG ref_private_status_reis_ai_14;
  REF_LONG ref_private_status_reis_bi_13;
  REF_LONG ref_private_status_reis_ai_13;
  REF_LONG ref_private_status_reis_bi_12;
  REF_LONG ref_private_status_reis_ai_12;
  int local_198;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_INT unique [4];
  int local_17c;
  REF_INT local_178;
  REF_INT m;
  REF_INT original_3 [4];
  REF_INT n_3;
  REF_LONG ref_private_status_reis_bi_11;
  REF_LONG ref_private_status_reis_ai_11;
  REF_LONG ref_private_status_reis_bi_10;
  REF_LONG ref_private_status_reis_ai_10;
  REF_LONG ref_private_status_reis_bi_9;
  REF_LONG ref_private_status_reis_ai_9;
  REF_LONG ref_private_status_reis_bi_8;
  REF_LONG ref_private_status_reis_ai_8;
  int local_118;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_INT sorted_2 [4];
  REF_INT original_2 [4];
  REF_INT n_2;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  int local_a8;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_INT sorted_1 [4];
  REF_INT original_1 [4];
  REF_INT n_1;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  int local_38;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sorted [4];
  REF_INT original [4];
  uint local_c;
  REF_INT n;
  
  sorted[2] = 1;
  sorted[3] = 2;
  local_c = ref_sort_insertion_int(4,sorted + 2,&local_38);
  if (local_c == 0) {
    if (local_38 == 1) {
      if (ref_private_macro_code_rss == 2) {
        if (sorted[0] == 3) {
          if (sorted[1] == 4) {
            sorted_1[2] = 4;
            sorted_1[3] = 3;
            local_c = ref_sort_insertion_int(4,sorted_1 + 2,&local_a8);
            if (local_c == 0) {
              if (local_a8 == 1) {
                if (ref_private_macro_code_rss_1 == 2) {
                  if (sorted_1[0] == 3) {
                    if (sorted_1[1] == 4) {
                      sorted_2[2] = 2;
                      sorted_2[3] = 1;
                      local_c = ref_sort_insertion_int(4,sorted_2 + 2,&local_118);
                      if (local_c == 0) {
                        if (local_118 == 1) {
                          if (ref_private_macro_code_rss_2 == 2) {
                            if (sorted_2[0] == 3) {
                              if (sorted_2[1] == 4) {
                                original_3[3] = 4;
                                local_178 = 2;
                                m = 1;
                                original_3[0] = 2;
                                original_3[1] = 3;
                                local_c = ref_sort_unique_int(4,&local_178,&local_17c,&local_198);
                                if (local_c == 0) {
                                  if (local_17c == 3) {
                                    if (local_198 == 1) {
                                      if (ref_private_macro_code_rss_3 == 2) {
                                        if (unique[0] == 3) {
                                          list1[2] = 0;
                                          list1[3] = 1;
                                          ref_private_macro_code_rss_4 = 3;
                                          same = 2;
                                          list1[0] = 1;
                                          list1[1] = 0;
                                          local_c = ref_sort_same(4,list1 + 2,
                                                                  &ref_private_macro_code_rss_4,&n_5
                                                                 );
                                          if (local_c == 0) {
                                            if (n_5 == 0) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x5d,"main","same");
                                              local_c = 1;
                                            }
                                            else {
                                              list1_1[2] = 4;
                                              list1_1[3] = 7;
                                              ref_private_macro_code_rss_5 = 4;
                                              same_1 = 7;
                                              list1_1[0] = 6;
                                              list1_1[1] = 5;
                                              local_c = ref_sort_same(4,list1_1 + 2,
                                                                      &ref_private_macro_code_rss_5,
                                                                      &n_6);
                                              if (local_c == 0) {
                                                if (n_6 == 0) {
                                                  printf("%s: %d: %s: %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x6c,"main","same");
                                                  local_c = 1;
                                                }
                                                else {
                                                  list1_2[2] = 0;
                                                  list1_2[3] = 1;
                                                  ref_private_macro_code_rss_6 = 3;
                                                  same_2 = 2;
                                                  list1_2[0] = 1;
                                                  list1_2[1] = 3;
                                                  local_c = ref_sort_same(4,list1_2 + 2,
                                                                          &
                                                  ref_private_macro_code_rss_6,&n_7);
                                                  if (local_c == 0) {
                                                    if (n_7 == 0) {
                                                      list1_3[2] = 0;
                                                      list1_3[3] = 1;
                                                      ref_private_macro_code_rss_7 = 3;
                                                      same_3 = 2;
                                                      list1_3[0] = 1;
                                                      list1_3[1] = 5;
                                                      local_c = ref_sort_same(4,list1_3 + 2,
                                                                              &
                                                  ref_private_macro_code_rss_7,&n_8);
                                                  if (local_c == 0) {
                                                    if (n_8 == 0) {
                                                      global[0] = -1;
                                                      global[1] = 0x1e;
                                                      global[2] = -1;
                                                      global[3] = -1;
                                                      global[4] = 0x14;
                                                      global[5] = -1;
                                                      ref_private_macro_code_rss_9 = 0;
                                                      for (local_2a8 = 0; local_2a8 < 7;
                                                          local_2a8 = local_2a8 + 1) {
                                                        if (global[(long)local_2a8 + -1] != -1) {
                                                          *(REF_GLOB *)
                                                           (pack + (long)
                                                  ref_private_macro_code_rss_9 * 2 + 6) =
                                                       global[(long)local_2a8 + -1];
                                                  sorted_index
                                                  [(long)ref_private_macro_code_rss_9 + 6] =
                                                       local_2a8;
                                                  ref_private_macro_code_rss_9 =
                                                       ref_private_macro_code_rss_9 + 1;
                                                  }
                                                  }
                                                  local_c = ref_sort_heap_glob(
                                                  ref_private_macro_code_rss_9,
                                                  (REF_GLOB *)(pack + 6),&total);
                                                  if (local_c == 0) {
                                                    for (local_2a8 = 0;
                                                        local_2a8 < ref_private_macro_code_rss_9;
                                                        local_2a8 = local_2a8 + 1) {
                                                      (&total)[local_2a8] =
                                                           sorted_index
                                                           [(long)(&total)[local_2a8] + 6];
                                                      *(REF_GLOB *)(pack + (long)local_2a8 * 2 + 6)
                                                           = global[(long)(&total)[local_2a8] + -1];
                                                    }
                                                    local_c = ref_sort_search_glob
                                                                        (
                                                  ref_private_macro_code_rss_9,
                                                  (REF_GLOB *)(pack + 6),10,
                                                  &ref_private_macro_code_rss_8);
                                                  if (local_c == 0) {
                                                    if ((&total)[ref_private_macro_code_rss_8] == 0)
                                                    {
                                                      local_c = ref_sort_search_glob
                                                                          (
                                                  ref_private_macro_code_rss_9,
                                                  (REF_GLOB *)(pack + 6),global[1],
                                                  &ref_private_macro_code_rss_8);
                                                  if (local_c == 0) {
                                                    if ((&total)[ref_private_macro_code_rss_8] == 2)
                                                    {
                                                      local_c = ref_sort_search_glob
                                                                          (
                                                  ref_private_macro_code_rss_9,
                                                  (REF_GLOB *)(pack + 6),global[4],
                                                  &ref_private_macro_code_rss_8);
                                                  if (local_c == 0) {
                                                    if ((&total)[ref_private_macro_code_rss_8] == 5)
                                                    {
                                                      sorted_global_1[3] = 0x28;
                                                      local_c = ref_sort_heap_glob(4,sorted_global_1
                                                                                     + 3,&
                                                  ref_private_macro_code_rss_12);
                                                  if (local_c == 0) {
                                                    for (local_400 = 0; local_400 < 4;
                                                        local_400 = local_400 + 1) {
                                                      *(REF_GLOB *)(&i_1 + (long)local_400 * 2) =
                                                           sorted_global_1
                                                           [(long)(&ref_private_macro_code_rss_12)
                                                                  [local_400] + 3];
                                                    }
                                                    local_c = ref_sort_search_glob
                                                                        (4,(REF_GLOB *)&i_1,
                                                                         sorted_global_1[3],
                                                                         &
                                                  ref_private_macro_code_rss_13);
                                                  if (local_c == 0) {
                                                    if ((&ref_private_macro_code_rss_12)
                                                        [ref_private_macro_code_rss_13] == 0) {
                                                      local_c = ref_sort_search_glob
                                                                          (4,(REF_GLOB *)&i_1,10,
                                                                           &
                                                  ref_private_macro_code_rss_13);
                                                  if (local_c == 0) {
                                                    if ((&ref_private_macro_code_rss_12)
                                                        [ref_private_macro_code_rss_13] == 1) {
                                                      local_c = ref_sort_search_glob
                                                                          (4,(REF_GLOB *)&i_1,0x1e,
                                                                           &
                                                  ref_private_macro_code_rss_13);
                                                  if (local_c == 0) {
                                                    if ((&ref_private_macro_code_rss_12)
                                                        [ref_private_macro_code_rss_13] == 2) {
                                                      local_c = ref_sort_search_glob
                                                                          (4,(REF_GLOB *)&i_1,0x14,
                                                                           &
                                                  ref_private_macro_code_rss_13);
                                                  if (local_c == 0) {
                                                    if ((&ref_private_macro_code_rss_12)
                                                        [ref_private_macro_code_rss_13] == 3) {
                                                      ascending_list[3]._4_4_ = 4;
                                                      RStack_4a8 = 10;
                                                      ascending_list[0] = 0x14;
                                                      ascending_list[1] = 0x1e;
                                                      ascending_list[2] = 0x28;
                                                      ref_private_status_reis_ai_23._4_4_ =
                                                           ref_sort_search_glob
                                                                     (4,&stack0xfffffffffffffb58,10,
                                                                      (REF_INT *)
                                                                      (ascending_list + 3));
                                                      if (ref_private_status_reis_ai_23._4_4_ == 0)
                                                      {
                                                        ref_private_status_reis_bi_23 = 0;
                                                        lStack_4c0 = (long)(int)ascending_list[3];
                                                        if (lStack_4c0 == 0) {
                                                          ref_private_status_reis_ai_24._4_4_ =
                                                               ref_sort_search_glob
                                                                         (ascending_list[3]._4_4_,
                                                                          &stack0xfffffffffffffb58,
                                                                          ascending_list[0],
                                                                          (REF_INT *)
                                                                          (ascending_list + 3));
                                                          if (ref_private_status_reis_ai_24._4_4_ ==
                                                              0) {
                                                            ref_private_status_reis_bi_24 = 1;
                                                            lStack_4d8 = (long)(int)ascending_list
                                                                                    [3];
                                                            if (lStack_4d8 == 1) {
                                                              ref_private_status_reis_ai_25._4_4_ =
                                                                   ref_sort_search_glob
                                                                             (ascending_list[3].
                                                                              _4_4_,&
                                                  stack0xfffffffffffffb58,ascending_list[1],
                                                  (REF_INT *)(ascending_list + 3));
                                                  if (ref_private_status_reis_ai_25._4_4_ == 0) {
                                                    ref_private_status_reis_bi_25 = 2;
                                                    lStack_4f0 = (long)(int)ascending_list[3];
                                                    if (lStack_4f0 == 2) {
                                                      ref_private_status_reis_ai_26._4_4_ =
                                                           ref_sort_search_glob
                                                                     (ascending_list[3]._4_4_,
                                                                      &stack0xfffffffffffffb58,
                                                                      ascending_list[2],
                                                                      (REF_INT *)
                                                                      (ascending_list + 3));
                                                      if (ref_private_status_reis_ai_26._4_4_ == 0)
                                                      {
                                                        ref_private_status_reis_bi_26 = 3;
                                                        ref_private_status_reis_ai_27 =
                                                             (REF_LONG)(int)ascending_list[3];
                                                        if (ref_private_status_reis_ai_27 == 3) {
                                                          ref_private_status_reis_bi_27 = 5;
                                                          RVar1 = ref_sort_search_glob
                                                                            (ascending_list[3]._4_4_
                                                                             ,&
                                                  stack0xfffffffffffffb58,0,
                                                  (REF_INT *)(ascending_list + 3));
                                                  ref_private_status_reis_ai_28 = (REF_LONG)RVar1;
                                                  if (ref_private_status_reis_bi_27 ==
                                                      ref_private_status_reis_ai_28) {
                                                    ref_private_status_reis_bi_28 = -1;
                                                    ref_private_status_reis_ai_29 =
                                                         (REF_LONG)(int)ascending_list[3];
                                                    if (ref_private_status_reis_ai_29 == -1) {
                                                      ref_private_status_reis_bi_29 = 5;
                                                      RVar1 = ref_sort_search_glob
                                                                        (ascending_list[3]._4_4_,
                                                                         &stack0xfffffffffffffb58,
                                                                         0xf,(REF_INT *)
                                                                             (ascending_list + 3));
                                                      ref_private_status_reis_ai_30 =
                                                           (REF_LONG)RVar1;
                                                      if (ref_private_status_reis_bi_29 ==
                                                          ref_private_status_reis_ai_30) {
                                                        ref_private_status_reis_bi_30 = -1;
                                                        ref_private_status_reis_ai_31 =
                                                             (REF_LONG)(int)ascending_list[3];
                                                        if (ref_private_status_reis_ai_31 == -1) {
                                                          ref_private_status_reis_bi_31 = 5;
                                                          RVar1 = ref_sort_search_glob
                                                                            (ascending_list[3]._4_4_
                                                                             ,&
                                                  stack0xfffffffffffffb58,0x32,
                                                  (REF_INT *)(ascending_list + 3));
                                                  ref_private_status_reis_ai_32 = (REF_LONG)RVar1;
                                                  if (ref_private_status_reis_bi_31 ==
                                                      ref_private_status_reis_ai_32) {
                                                    ref_private_status_reis_bi_32 = -1;
                                                    _position_3 = (long)(int)ascending_list[3];
                                                    if (_position_3 == -1) {
                                                      ascending_list_1._4_4_ = 0;
                                                      ref_private_status_reis_ai_33 = 0;
                                                      ascending_list_1._0_4_ = 0;
                                                      ref_private_status_reis_bi_33 = 5;
                                                      RVar1 = ref_sort_search_glob
                                                                        (0,(REF_GLOB *)0x0,0x11,
                                                                         (REF_INT *)
                                                                         &ascending_list_1);
                                                      ref_private_status_reis_ai_34 =
                                                           (REF_LONG)RVar1;
                                                      if (ref_private_status_reis_bi_33 ==
                                                          ref_private_status_reis_ai_34) {
                                                        ref_private_status_reis_bi_34 = -1;
                                                        _position_4 = (long)(int)ascending_list_1;
                                                        if (_position_4 == -1) {
                                                          local_59c = 4;
                                                          local_5a0 = 0;
                                                          ref_private_status_reis_ai_35 = 0;
                                                          ascending_list_2[0] = 0.5;
                                                          ascending_list_2[1] = 1.0;
                                                          ascending_list_2[2] = 2.0;
                                                          RVar1 = ref_sort_search_dbl(0,(REF_DBL *)
                                                                                        &
                                                  ref_private_status_reis_ai_35,-1.0,&local_5a0);
                                                  if (RVar1 == 5) {
                                                    if (local_5a0 == -1) {
                                                      local_c = ref_sort_search_dbl(1,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,-1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(1,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,0.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(1,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(2,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,-1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(2,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,0.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(2,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,0.1,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(2,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,0.5,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(2,(REF_DBL *)
                                                                                      &
                                                  ref_private_status_reis_ai_35,1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,-1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,0.1,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 0) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,0.5,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 1) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,1.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 2) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,1.5,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 2) {
                                                      local_c = ref_sort_search_dbl(local_59c,
                                                                                    (REF_DBL *)
                                                                                    &
                                                  ref_private_status_reis_ai_35,5.0,&local_5a0);
                                                  if (local_c == 0) {
                                                    if (local_5a0 == 2) {
                                                      sorted_index_2[0] = 0;
                                                      ref_private_macro_code_rss_35 = 1;
                                                      ref_private_status_reis_ai_51._4_4_ = 2;
                                                      ref_private_status_reis_ai_51._0_4_ =
                                                           ref_sort_heap_int(0,&
                                                  ref_private_macro_code_rss_35,
                                                  (REF_INT *)
                                                  ((long)&ref_private_status_reis_ai_51 + 4));
                                                  if ((uint)ref_private_status_reis_ai_51 == 0) {
                                                    if (ref_private_status_reis_ai_51._4_4_ == 2) {
                                                      sorted_index_3[0] = 1;
                                                      ref_private_macro_code_rss_36 = 1;
                                                      ref_private_status_reis_ai_52._4_4_ = 2;
                                                      ref_private_status_reis_ai_52._0_4_ =
                                                           ref_sort_heap_int(1,&
                                                  ref_private_macro_code_rss_36,
                                                  (REF_INT *)
                                                  ((long)&ref_private_status_reis_ai_52 + 4));
                                                  if ((uint)ref_private_status_reis_ai_52 == 0) {
                                                    if (ref_private_status_reis_ai_52._4_4_ == 0) {
                                                      sorted_index_4[0] = 1;
                                                      sorted_index_4[1] = 2;
                                                      ref_private_status_reis_ai_53._0_4_ =
                                                           ref_sort_heap_int(2,sorted_index_4,
                                                                             (REF_INT *)
                                                                             ((long)&
                                                  ref_private_status_reis_ai_53 + 4));
                                                  if ((uint)ref_private_status_reis_ai_53 == 0) {
                                                    if (ref_private_status_reis_ai_53._4_4_ == 0) {
                                                      if (ref_private_macro_code_rss_37 == 1) {
                                                        sorted_index_5[0] = 2;
                                                        sorted_index_5[1] = 1;
                                                        ref_private_status_reis_ai_55._0_4_ =
                                                             ref_sort_heap_int(2,sorted_index_5,
                                                                               (REF_INT *)
                                                                               ((long)&
                                                  ref_private_status_reis_ai_55 + 4));
                                                  if ((uint)ref_private_status_reis_ai_55 == 0) {
                                                    if (ref_private_status_reis_ai_55._4_4_ == 1) {
                                                      if (ref_private_macro_code_rss_38 == 0) {
                                                        sorted_index_6[1] = 0;
                                                        sorted_index_6[2] = 1;
                                                        ref_private_status_reis_ai_57._0_4_ =
                                                             ref_sort_heap_int(3,sorted_index_6 + 1,
                                                                               (REF_INT *)
                                                                               ((long)&
                                                  ref_private_status_reis_ai_57 + 4));
                                                  if ((uint)ref_private_status_reis_ai_57 == 0) {
                                                    if (ref_private_status_reis_ai_57._4_4_ == 0) {
                                                      if (ref_private_macro_code_rss_39 == 1) {
                                                        if (sorted_index_6[0] == 2) {
                                                          sorted_index_7[1] = 2;
                                                          sorted_index_7[2] = 0;
                                                          ref_private_status_reis_ai_60._0_4_ =
                                                               ref_sort_heap_int(3,sorted_index_7 +
                                                                                   1,(REF_INT *)
                                                                                     ((long)&
                                                  ref_private_status_reis_ai_60 + 4));
                                                  if ((uint)ref_private_status_reis_ai_60 == 0) {
                                                    if (ref_private_status_reis_ai_60._4_4_ == 1) {
                                                      if (ref_private_macro_code_rss_40 == 2) {
                                                        if (sorted_index_7[0] == 0) {
                                                          sorted_index_8[2] = 0;
                                                          sorted_index_8[3] = 0;
                                                          local_c = ref_sort_heap_dbl(4,(REF_DBL *)
                                                                                        (
                                                  sorted_index_8 + 2),&local_8c8);
                                                  if (local_c == 0) {
                                                    if (local_8c8 == 3) {
                                                      if (ref_private_macro_code_rss_41 == 0) {
                                                        if (sorted_index_8[0] == 2) {
                                                          if (sorted_index_8[1] == 1) {
                                                            count[0xf] = 1;
                                                            count[0xe] = 0xe;
                                                            for (ref_private_status_reis_ai_67._4_4_
                                                                      = 0;
                                                                ref_private_status_reis_ai_67._4_4_
                                                                < 0x10; 
                                                  ref_private_status_reis_ai_67._4_4_ =
                                                       ref_private_status_reis_ai_67._4_4_ + 1) {
                                                    (&i_2)[ref_private_status_reis_ai_67._4_4_] = 0;
                                                  }
                                                  for (n_20 = 0; n_20 < 1000000; n_20 = n_20 + 1) {
                                                    RVar2 = ref_sort_rand_in_range
                                                                      (count[0xf],count[0xe]);
                                                    (&i_2)[RVar2] = (&i_2)[RVar2] + 1;
                                                  }
                                                  if ((&i_2)[count[0xf] + -1] == 0) {
                                                    if ((&i_2)[count[0xf]] == 0) {
                                                      printf("%s: %d: %s: %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x16a,"main","zero min");
                                                  local_c = 1;
                                                  }
                                                  else if ((&i_2)[count[0xe]] == 0) {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x16b,"main","zero max");
                                                  local_c = 1;
                                                  }
                                                  else if ((&i_2)[count[0xe] + 1] == 0) {
                                                    local_c = ref_sort_shuffle(1000000,count_1 + 
                                                  0xf423e);
                                                  if (local_c == 0) {
                                                    for (ref_private_status_reis_ai_69._4_4_ = 0;
                                                        ref_private_status_reis_ai_69._4_4_ <
                                                        1000000; ref_private_status_reis_ai_69._4_4_
                                                                      = 
                                                  ref_private_status_reis_ai_69._4_4_ + 1) {
                                                    (&ref_private_macro_code_rss_42)
                                                    [ref_private_status_reis_ai_69._4_4_] = 0;
                                                  }
                                                  for (ref_private_status_reis_ai_69._4_4_ = 0;
                                                      ref_private_status_reis_ai_69._4_4_ < 1000000;
                                                      ref_private_status_reis_ai_69._4_4_ =
                                                           ref_private_status_reis_ai_69._4_4_ + 1)
                                                  {
                                                    (&ref_private_macro_code_rss_42)
                                                    [count_1[(long)ref_private_status_reis_ai_69.
                                                                   _4_4_ + 0xf423e]] =
                                                         (&ref_private_macro_code_rss_42)
                                                         [count_1[(long)
                                                  ref_private_status_reis_ai_69._4_4_ + 0xf423e]] +
                                                  1;
                                                  }
                                                  for (ref_private_status_reis_ai_69._4_4_ = 0;
                                                      ref_private_status_reis_ai_69._4_4_ < 1000000;
                                                      ref_private_status_reis_ai_69._4_4_ =
                                                           ref_private_status_reis_ai_69._4_4_ + 1)
                                                  {
                                                    if ((&ref_private_macro_code_rss_42)
                                                        [ref_private_status_reis_ai_69._4_4_] != 1)
                                                    {
                                                      printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x175,"main","missing/dup entry",1);
                                                  return 1;
                                                  }
                                                  }
                                                  local_c = 0;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x172,"main",(ulong)local_c,"shuffle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x16c,"main","max off-by-one",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x169,"main","min off-by-one",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x15d,"main","sorted_index[3]",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x15c,"main","sorted_index[2]",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x15b,"main","sorted_index[1]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x15a,"main","sorted_index[0]",3);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x159,"main",(ulong)local_c,"sort");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x14e,"main","sorted_index[2]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x14d,"main","sorted_index[1]",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x14c,"main","sorted_index[0]",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x14b,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_60,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_60;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x143,"main","sorted_index[2]",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x142,"main","sorted_index[1]",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x141,"main","sorted_index[0]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x140,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_57,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_57;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x138,"main","sorted_index[1]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x137,"main","sorted_index[0]",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x136,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_55,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_55;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x12f,"main","sorted_index[1]",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x12e,"main","sorted_index[0]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x12d,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_53,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_53;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x126,"main","sorted_index[0]",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x125,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_52,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_52;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x11e,"main","sorted_index[0]",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x11d,"main",
                                                  (ulong)(uint)ref_private_status_reis_ai_51,"sort")
                                                  ;
                                                  local_c = (uint)ref_private_status_reis_ai_51;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x116,"main","only",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x115,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x114,"main","only",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x113,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x112,"main","only",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x111,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x110,"main","only",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x10f,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x10e,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x10d,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x10c,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x10b,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x109,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x108,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x107,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x106,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x105,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x104,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x103,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x102,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x101,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x100,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xfe,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xfd,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xfc,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xfb,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xfa,"main","only",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xf9,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xf7,"main","under",0xffffffffffffffff);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xf6,"main","search",5);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xee,"main","0",0xffffffffffffffff);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xed,"main","search",
                                                  ref_private_status_reis_bi_33);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xe4,"main","50",0xffffffffffffffff);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xe3,"main","search",
                                                  ref_private_status_reis_bi_31);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xe1,"main","15",0xffffffffffffffff);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xe0,"main","search",
                                                  ref_private_status_reis_bi_29);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xde,"main","0",0xffffffffffffffff);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xdd,"main","search",
                                                  ref_private_status_reis_bi_27);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xda,"main","3",3);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd9,"main",
                                                  (ulong)ref_private_status_reis_ai_26._4_4_,
                                                  "search");
                                                  local_c = ref_private_status_reis_ai_26._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd7,"main","2",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd6,"main",
                                                  (ulong)ref_private_status_reis_ai_25._4_4_,
                                                  "search");
                                                  local_c = ref_private_status_reis_ai_25._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd4,"main","1",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd3,"main",
                                                  (ulong)ref_private_status_reis_ai_24._4_4_,
                                                  "search");
                                                  local_c = ref_private_status_reis_ai_24._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd1,"main","0",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xd0,"main",
                                                  (ulong)ref_private_status_reis_ai_23._4_4_,
                                                  "search");
                                                  local_c = ref_private_status_reis_ai_23._4_4_;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xc4,"main","3",3);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xc3,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xc2,"main","2",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xc1,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xc0,"main","1",1);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xbf,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xbe,"main","0",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xbd,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xb9,"main",(ulong)local_c,"sort");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xaf,"main","5",5);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xae,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xac,"main","2",2);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xab,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xa9,"main","0",0);
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xa8,"main",(ulong)local_c,"search");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0xa2,"main",(ulong)local_c,"sort");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x8c,"main","same");
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x8b,"main",(ulong)local_c,"same");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x7c,"main","same");
                                                  local_c = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x7b,"main",(ulong)local_c,"same");
                                                  }
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x6b,"main",(ulong)local_c,"same");
                                              }
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                  ,0x5c,"main",(ulong)local_c,"same");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                                 ,0x4d,"main","unique[2]",3);
                                          local_c = 1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                               ,0x4c,"main","unique[1]",2);
                                        local_c = 1;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                             ,0x4b,"main","unique[0]",1);
                                      local_c = 1;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                           ,0x4a,"main","m",3);
                                    local_c = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                         ,0x49,"main",(ulong)local_c,"unique");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                       ,0x40,"main","sorted[3]",4);
                                local_c = 1;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                     ,0x3f,"main","sorted[2]",3);
                              local_c = 1;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                   ,0x3e,"main","sorted[1]",2);
                            local_c = 1;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                                 ,0x3d,"main","sorted[0]",1);
                          local_c = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                               ,0x3c,"main",(ulong)local_c,"sort");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                             ,0x33,"main","sorted[3]",4);
                      local_c = 1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                           ,0x32,"main","sorted[2]",3);
                    local_c = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                         ,0x31,"main","sorted[1]",2);
                  local_c = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                       ,0x30,"main","sorted[0]",1);
                local_c = 1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                     ,0x2f,"main",(ulong)local_c,"sort");
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                   ,0x26,"main","sorted[3]",4);
            local_c = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
                 ,0x25,"main","sorted[2]",3);
          local_c = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c"
               ,0x24,"main","sorted[1]",2);
        local_c = 1;
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
             0x23,"main","sorted[0]",1);
      local_c = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_sort_test.c",
           0x22,"main",(ulong)local_c,"sort");
  }
  return local_c;
}

Assistant:

int main(void) {
  { /* insert sort ordered */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 1;
    original[1] = 2;
    original[2] = 3;
    original[3] = 4;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 4;
    original[1] = 3;
    original[2] = 2;
    original[3] = 1;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* insert sort flip flip */
    REF_INT n = 4, original[4], sorted[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 4;
    original[3] = 3;
    RSS(ref_sort_insertion_int(n, original, sorted), "sort");
    REIS(1, sorted[0], "sorted[0]");
    REIS(2, sorted[1], "sorted[1]");
    REIS(3, sorted[2], "sorted[2]");
    REIS(4, sorted[3], "sorted[3]");
  }

  { /* unique */
    REF_INT n = 4, original[4], m, unique[4];
    original[0] = 2;
    original[1] = 1;
    original[2] = 2;
    original[3] = 3;
    RSS(ref_sort_unique_int(n, original, &m, unique), "unique");
    REIS(3, m, "m");
    REIS(1, unique[0], "unique[0]");
    REIS(2, unique[1], "unique[1]");
    REIS(3, unique[2], "unique[2]");
  }

  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 0;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }
  { /* same */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 4;
    list0[1] = 7;
    list0[2] = 6;
    list0[3] = 5;

    list1[0] = 4;
    list1[1] = 7;
    list1[2] = 6;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(same, "same");
  }

  { /* same repeat */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 3;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* same diff */
    REF_INT n = 4, list0[4], list1[4];
    REF_BOOL same;
    list0[0] = 0;
    list0[1] = 1;
    list0[2] = 2;
    list0[3] = 3;

    list1[0] = 3;
    list1[1] = 2;
    list1[2] = 1;
    list1[3] = 5;
    RSS(ref_sort_same(n, list0, list1, &same), "same");
    RAS(!same, "same");
  }

  { /* sparse global to local */
    REF_INT n = 7, i;
    REF_GLOB global[7], sorted_global[7];
    REF_INT pack[7], sorted_index[7], position, total;
    global[0] = 10;
    global[1] = REF_EMPTY;
    global[2] = 30;
    global[3] = REF_EMPTY;
    global[4] = REF_EMPTY;
    global[5] = 20;
    global[6] = REF_EMPTY;
    total = 0;
    for (i = 0; i < n; i++) {
      if (REF_EMPTY != global[i]) {
        sorted_global[total] = global[i];
        pack[total] = i;
        total++;
      }
    }
    RSS(ref_sort_heap_glob(total, sorted_global, sorted_index), "sort");
    for (i = 0; i < total; i++) {
      sorted_index[i] = pack[sorted_index[i]];
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(total, sorted_global, global[0], &position),
        "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(total, sorted_global, global[2], &position),
        "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(total, sorted_global, global[5], &position),
        "search");
    REIS(5, sorted_index[position], "5");
  }

  { /* dense global to local */
    REF_GLOB global[4], sorted_global[4];
    REF_INT n = 4, i, sorted_index[4], position;
    global[0] = 40;
    global[1] = 10;
    global[2] = 30;
    global[3] = 20;
    RSS(ref_sort_heap_glob(n, global, sorted_index), "sort");
    for (i = 0; i < n; i++) {
      sorted_global[i] = global[sorted_index[i]];
    }
    RSS(ref_sort_search_glob(n, sorted_global, global[0], &position), "search");
    REIS(0, sorted_index[position], "0");
    RSS(ref_sort_search_glob(n, sorted_global, global[1], &position), "search");
    REIS(1, sorted_index[position], "1");
    RSS(ref_sort_search_glob(n, sorted_global, global[2], &position), "search");
    REIS(2, sorted_index[position], "2");
    RSS(ref_sort_search_glob(n, sorted_global, global[3], &position), "search");
    REIS(3, sorted_index[position], "3");
  }

  { /* search */
    REF_INT n = 4, position;
    REF_GLOB ascending_list[4];
    ascending_list[0] = 10;
    ascending_list[1] = 20;
    ascending_list[2] = 30;
    ascending_list[3] = 40;

    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[0], &position),
        "search");
    REIS(0, position, "0");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[1], &position),
        "search");
    REIS(1, position, "1");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[2], &position),
        "search");
    REIS(2, position, "2");
    RSS(ref_sort_search_glob(n, ascending_list, ascending_list[3], &position),
        "search");
    REIS(3, position, "3");

    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 0, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 15, &position),
         "search");
    REIS(REF_EMPTY, position, "15");
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 50, &position),
         "search");
    REIS(REF_EMPTY, position, "50");
  }

  { /* search 0 */
    REF_INT n = 0, position;
    REF_GLOB *ascending_list = NULL;

    position = 0;
    REIS(REF_NOT_FOUND, ref_sort_search_glob(n, ascending_list, 17, &position),
         "search");
    REIS(REF_EMPTY, position, "0");
  }

  { /* search dbl */
    REF_INT n = 4, position = 0;
    REF_DBL ascending_list[] = {0.0, 0.5, 1.0, 2.0};

    REIS(REF_NOT_FOUND, ref_sort_search_dbl(0, ascending_list, -1.0, &position),
         "search");
    REIS(REF_EMPTY, position, "under");

    RSS(ref_sort_search_dbl(1, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(1, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(2, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 0.5, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(2, ascending_list, 1.0, &position), "search");
    REIS(0, position, "only");

    RSS(ref_sort_search_dbl(n, ascending_list, -1.0, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.1, &position), "search");
    REIS(0, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 0.5, &position), "search");
    REIS(1, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.0, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 1.5, &position), "search");
    REIS(2, position, "only");
    RSS(ref_sort_search_dbl(n, ascending_list, 5.0, &position), "search");
    REIS(2, position, "only");
  }

  { /* heap sort zero int */
    REF_INT n = 0, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(2, sorted_index[0], "sorted_index[0]");
  }

  { /* heap sort one int */
    REF_INT n = 1, original[1], sorted_index[1];
    original[0] = 1;
    sorted_index[0] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
  }

  { /* heap two order int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 1;
    original[1] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
  }

  { /* heap two reversed int */
    REF_INT n = 2, original[2], sorted_index[2];
    original[0] = 2;
    original[1] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
  }

  { /* heap three 012 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 0;
    original[1] = 1;
    original[2] = 2;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(0, sorted_index[0], "sorted_index[0]");
    REIS(1, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
  }

  { /* heap three 120 int */
    REF_INT n = 3, original[3], sorted_index[3];
    original[0] = 2;
    original[1] = 0;
    original[2] = 1;
    RSS(ref_sort_heap_int(n, original, sorted_index), "sort");
    REIS(1, sorted_index[0], "sorted_index[0]");
    REIS(2, sorted_index[1], "sorted_index[1]");
    REIS(0, sorted_index[2], "sorted_index[2]");
  }

  { /* heap dbl */
    REF_INT n = 4;
    REF_DBL original[4];
    REF_INT sorted_index[4];
    original[0] = 0.0;
    original[1] = 7.0;
    original[2] = 3.0;
    original[3] = -1.0;
    RSS(ref_sort_heap_dbl(n, original, sorted_index), "sort");
    REIS(3, sorted_index[0], "sorted_index[0]");
    REIS(0, sorted_index[1], "sorted_index[1]");
    REIS(2, sorted_index[2], "sorted_index[2]");
    REIS(1, sorted_index[3], "sorted_index[3]");
  }

  { /* rand range */
    REF_INT min = 1, max = 14;
    REF_INT count[16], m = 16;
    REF_INT i, j, n = 1000000;
    for (j = 0; j < m; j++) count[j] = 0;
    for (i = 0; i < n; i++) {
      j = ref_sort_rand_in_range(min, max);
      count[j]++;
    }
    REIS(0, count[min - 1], "min off-by-one");
    RAS(0 != count[min], "zero min");
    RAS(0 != count[max], "zero max");
    REIS(0, count[max + 1], "max off-by-one");
  }

  { /* rand range */
    REF_INT n = 1000000, permutation[1000000], count[1000000];
    REF_INT i;
    RSS(ref_sort_shuffle(n, permutation), "shuffle");
    for (i = 0; i < n; i++) count[i] = 0;
    for (i = 0; i < n; i++) count[permutation[i]]++;
    for (i = 0; i < n; i++) REIS(1, count[i], "missing/dup entry");
  }

  return 0;
}